

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles3::Functional::NumLayersParams::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,NumLayersParams *this,NumLayersParams *params)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string kindStr;
  ostringstream os;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar3 = "2D Array Texture";
  if (this->textureKind == 0x806f) {
    pcVar3 = "3D Texture";
  }
  pcVar2 = pcVar3 + 0x10;
  if (this->textureKind == 0x806f) {
    pcVar2 = pcVar3 + 10;
  }
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,pcVar3,pcVar2);
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_1c0,local_1b8 + (long)local_1c0);
  std::__cxx11::string::append((char *)&local_1e0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(char *)local_1e0,local_1d8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->numLayers);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," layers, ",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"attached layer ",0xf);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->attachmentLayer);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string NumLayersParams::getDescription (const NumLayersParams& params)
{
	ostringstream os;
	const string kindStr = (params.textureKind == GL_TEXTURE_3D
							? "3D Texture"
							: "2D Array Texture");
	os << kindStr + ", "
	   << params.numLayers << " layers, "
	   << "attached layer " << params.attachmentLayer << ".";
	return os.str();
}